

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O2

void __thiscall
FTraceInfo::EnterSectorPortal
          (FTraceInfo *this,FPathTraverse *pt,int position,double frac,sector_t_conflict *entersec)

{
  _func_ETraceStatus_FTraceResults_ptr_void_ptr *p_Var1;
  FTraceResults *pFVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  sector_t_conflict *psVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  DVector2 local_38;
  
  dVar15 = this->MaxDist * frac;
  dVar6 = (this->Start).X;
  dVar7 = (this->Start).Y;
  dVar12 = (this->Vec).Z * dVar15 + (this->Start).Z;
  dVar16 = dVar15 * (this->Vec).X + dVar6;
  dVar17 = dVar15 * (this->Vec).Y + dVar7;
  dVar4 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.X;
  dVar5 = sectorPortals.Array[entersec->Portals[position]].mDisplacement.Y;
  dVar13 = dVar4 + dVar16;
  dVar14 = dVar5 + dVar17;
  dVar4 = dVar4 + dVar6;
  dVar5 = dVar5 + dVar7;
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  (this->Start).X = dVar4;
  (this->Start).Y = (double)auVar3._8_8_;
  local_38.X = dVar13;
  local_38.Y = dVar14;
  psVar11 = P_PointInSector(&local_38);
  this->CurSector = psVar11;
  this->inshootthrough = 1;
  this->startfrac = frac;
  this->EnterDist = dVar15;
  FPathTraverse::PortalRelocate
            (pt,&sectorPortals.Array[entersec->Portals[position]].mDisplacement,this->ptflags,frac);
  if (((this->TraceFlags & 0x10) != 0) &&
     (p_Var1 = this->TraceCallback, p_Var1 != (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0))
  {
    pFVar2 = this->Results;
    pFVar2->HitType = TRACE_CrossingPortal;
    (pFVar2->HitPos).Z = dVar12;
    (pFVar2->HitPos).X = dVar16;
    (pFVar2->HitPos).Y = dVar17;
    (pFVar2->SrcFromTarget).Z = dVar12;
    (pFVar2->SrcFromTarget).X = dVar13;
    (pFVar2->SrcFromTarget).Y = dVar14;
    (pFVar2->HitVector).Z = (this->Vec).Z;
    uVar8 = *(undefined4 *)((long)&(this->Vec).X + 4);
    uVar9 = *(undefined4 *)&(this->Vec).Y;
    uVar10 = *(undefined4 *)((long)&(this->Vec).Y + 4);
    *(undefined4 *)&(pFVar2->HitVector).X = *(undefined4 *)&(this->Vec).X;
    *(undefined4 *)((long)&(pFVar2->HitVector).X + 4) = uVar8;
    *(undefined4 *)&(pFVar2->HitVector).Y = uVar9;
    *(undefined4 *)((long)&(pFVar2->HitVector).Y + 4) = uVar10;
    (*p_Var1)(pFVar2,this->TraceCallbackData);
  }
  Setup3DFloors(this);
  return;
}

Assistant:

void FTraceInfo::EnterSectorPortal(FPathTraverse &pt, int position, double frac, sector_t *entersec)
{
	DVector2 displacement = entersec->GetPortalDisplacement(position);;
	double enterdist = MaxDist * frac;
	DVector3 exit = Start + enterdist * Vec;
	DVector3 enter = exit + displacement;

	Start += displacement;
	CurSector = P_PointInSector(enter);
	inshootthrough = true;
	startfrac = frac;
	EnterDist = enterdist;
	pt.PortalRelocate(entersec->GetPortal(position)->mDisplacement, ptflags, frac);

	if ((TraceFlags & TRACE_ReportPortals) && TraceCallback != NULL)
	{
		enterdist = MaxDist * frac;
		Results->HitType = TRACE_CrossingPortal;
		Results->HitPos = exit;
		Results->SrcFromTarget = enter;
		Results->HitVector = Vec;
		TraceCallback(*Results, TraceCallbackData);
	}

	Setup3DFloors();
}